

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::CompilerGLSL::unroll_array_from_complex_load
          (CompilerGLSL *this,uint32_t target_id,uint32_t source_id,string *expr)

{
  BaseType expr_type;
  SPIRType *pSVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  SPIRVariable *var;
  CompilerError *this_00;
  char (*in_R8) [10];
  bool bVar6;
  bool bVar7;
  uint32_t target_id_local;
  SPIRType *local_208;
  string array_expr;
  string new_expr;
  string local_1c0;
  string local_1a0;
  undefined1 local_180 [32];
  uint *local_160;
  size_t local_158;
  size_t local_150;
  uint local_148 [8];
  bool *local_128;
  size_t local_120;
  size_t local_118;
  bool local_110 [8];
  uint32_t local_108;
  bool local_104;
  bool local_103;
  StorageClass local_100;
  TypedID<(diligent_spirv_cross::Types)1> *local_f8;
  size_t local_f0;
  size_t local_e8;
  TypedID<(diligent_spirv_cross::Types)1> local_e0 [8];
  uint *local_c0;
  size_t local_b8;
  size_t local_b0;
  uint local_a8 [8];
  undefined1 local_88 [28];
  TypeID local_6c;
  char (*local_68) [4];
  size_type local_60;
  __node_base local_58;
  size_type sStack_50;
  float local_48;
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  if (((((this->backend).force_gl_in_out_block == true) &&
       (target_id_local = target_id,
       var = Compiler::maybe_get<diligent_spirv_cross::SPIRVariable>
                       (&this->super_Compiler,source_id), var != (SPIRVariable *)0x0)) &&
      ((var->storage | StorageClassUniform) == Output)) &&
     (local_208 = Compiler::get_variable_data_type(&this->super_Compiler,var),
     (local_208->array).super_VectorView<unsigned_int>.buffer_size != 0)) {
    uVar5 = Compiler::get_decoration
                      (&this->super_Compiler,(ID)(var->super_IVariant).self.id,BuiltIn);
    bVar2 = Compiler::is_builtin_variable(&this->super_Compiler,var);
    bVar6 = uVar5 < 2;
    bVar7 = uVar5 == 0x14;
    bVar3 = Compiler::is_tessellation_shader(&this->super_Compiler);
    bVar4 = Compiler::has_decoration
                      (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationPatch);
    pSVar1 = local_208;
    if ((bVar3 || bVar2 && (bVar7 || bVar6)) && (!bVar4)) {
      join<char_const(&)[2],unsigned_int&,char_const(&)[10]>
                (&new_expr,(diligent_spirv_cross *)0x801cf9,(char (*) [2])&target_id_local,
                 (uint *)"_unrolled",in_R8);
      (*(this->super_Compiler)._vptr_Compiler[0x1b])
                (local_180,this,pSVar1,&new_expr,(ulong)target_id_local);
      statement<std::__cxx11::string,char_const(&)[2]>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180
                 ,(char (*) [2])0x800eb9);
      ::std::__cxx11::string::~string((string *)local_180);
      array_expr._M_dataplus._M_p = (pointer)&array_expr.field_2;
      array_expr._M_string_length = 0;
      array_expr.field_2._M_local_buf[0] = '\0';
      if ((pSVar1->array_size_literal).super_VectorView<bool>.ptr
          [(pSVar1->array_size_literal).super_VectorView<bool>.buffer_size - 1] == true) {
        convert_to_string<unsigned_int,_0>
                  ((string *)local_180,
                   (pSVar1->array).super_VectorView<unsigned_int>.ptr +
                   ((pSVar1->array).super_VectorView<unsigned_int>.buffer_size - 1));
        ::std::__cxx11::string::operator=((string *)&array_expr,(string *)local_180);
        ::std::__cxx11::string::~string((string *)local_180);
        if ((pSVar1->array).super_VectorView<unsigned_int>.ptr
            [(pSVar1->array).super_VectorView<unsigned_int>.buffer_size - 1] == 0) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(this_00,"Cannot unroll an array copy from unsized array.");
          __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      else {
        to_expression_abi_cxx11_
                  ((string *)local_180,this,
                   (pSVar1->array).super_VectorView<unsigned_int>.ptr
                   [(pSVar1->array).super_VectorView<unsigned_int>.buffer_size - 1],true);
        ::std::__cxx11::string::operator=((string *)&array_expr,(string *)local_180);
        ::std::__cxx11::string::~string((string *)local_180);
      }
      statement<char_const(&)[25],std::__cxx11::string&,char_const(&)[8]>
                (this,(char (*) [25])"for (int i = 0; i < int(",&array_expr,(char (*) [8])"); i++)")
      ;
      begin_scope(this);
      if ((bVar2 && (bVar7 || bVar6)) && uVar5 != 0x14) {
        statement<std::__cxx11::string&,char_const(&)[16],std::__cxx11::string&,char_const(&)[2]>
                  (this,&new_expr,(char (*) [16])"[i] = gl_in[i].",expr,(char (*) [2])0x800eb9);
      }
      else if (uVar5 == 0x14 && (bVar2 && (bVar7 || bVar6))) {
        local_160 = local_148;
        local_180._8_4_ = 0;
        local_180._0_8_ = &PTR__SPIRType_00ac2d18;
        local_180._12_4_ = 0x15;
        local_180._20_4_ = 0;
        local_180._24_4_ = 1;
        local_158 = 0;
        local_150 = 8;
        local_128 = local_110;
        local_120 = 0;
        local_118 = 8;
        local_108 = 0;
        local_104 = false;
        local_103 = false;
        local_100 = Generic;
        local_f8 = local_e0;
        local_f0 = 0;
        local_e8 = 8;
        local_c0 = local_a8;
        local_b8 = 0;
        local_b0 = 8;
        local_68 = (char (*) [4])&p_Stack_38;
        local_88._0_7_ = 0;
        local_88._7_4_ = 0;
        local_6c.id = 0;
        local_88._12_4_ = 0;
        local_88._16_4_ = ImageFormatUnknown;
        local_88._20_4_ = AccessQualifierReadOnly;
        local_88._24_4_ = 0;
        local_60 = 1;
        local_58._M_nxt = (_Hash_node_base *)0x0;
        sStack_50 = 0;
        local_48 = 1.0;
        local_40 = 0;
        p_Stack_38 = (__node_base_ptr)0x0;
        local_180._16_4_ = 7;
        expr_type = pSVar1->basetype;
        local_180._28_4_ = local_180._24_4_;
        join<std::__cxx11::string&,char_const(&)[4]>
                  (&local_1c0,(diligent_spirv_cross *)expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"[i]",
                   local_68);
        bitcast_expression(&local_1a0,this,(SPIRType *)local_180,expr_type,&local_1c0);
        statement<std::__cxx11::string&,char_const(&)[7],std::__cxx11::string,char_const(&)[2]>
                  (this,&new_expr,(char (*) [7])"[i] = ",&local_1a0,(char (*) [2])0x800eb9);
        ::std::__cxx11::string::~string((string *)&local_1a0);
        ::std::__cxx11::string::~string((string *)&local_1c0);
        SPIRType::~SPIRType((SPIRType *)local_180);
      }
      else {
        statement<std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[5]>
                  (this,&new_expr,(char (*) [7])"[i] = ",expr,(char (*) [5])"[i];");
      }
      end_scope(this);
      ::std::__cxx11::string::operator=((string *)expr,(string *)&new_expr);
      ::std::__cxx11::string::~string((string *)&array_expr);
      ::std::__cxx11::string::~string((string *)&new_expr);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::unroll_array_from_complex_load(uint32_t target_id, uint32_t source_id, std::string &expr)
{
	if (!backend.force_gl_in_out_block)
		return;
	// This path is only relevant for GL backends.

	auto *var = maybe_get<SPIRVariable>(source_id);
	if (!var)
		return;

	if (var->storage != StorageClassInput && var->storage != StorageClassOutput)
		return;

	auto &type = get_variable_data_type(*var);
	if (type.array.empty())
		return;

	auto builtin = BuiltIn(get_decoration(var->self, DecorationBuiltIn));
	bool is_builtin = is_builtin_variable(*var) &&
	                  (builtin == BuiltInPointSize ||
	                   builtin == BuiltInPosition ||
	                   builtin == BuiltInSampleMask);
	bool is_tess = is_tessellation_shader();
	bool is_patch = has_decoration(var->self, DecorationPatch);
	bool is_sample_mask = is_builtin && builtin == BuiltInSampleMask;

	// Tessellation input arrays are special in that they are unsized, so we cannot directly copy from it.
	// We must unroll the array load.
	// For builtins, we couldn't catch this case normally,
	// because this is resolved in the OpAccessChain in most cases.
	// If we load the entire array, we have no choice but to unroll here.
	if (!is_patch && (is_builtin || is_tess))
	{
		auto new_expr = join("_", target_id, "_unrolled");
		statement(variable_decl(type, new_expr, target_id), ";");
		string array_expr;
		if (type.array_size_literal.back())
		{
			array_expr = convert_to_string(type.array.back());
			if (type.array.back() == 0)
				SPIRV_CROSS_THROW("Cannot unroll an array copy from unsized array.");
		}
		else
			array_expr = to_expression(type.array.back());

		// The array size might be a specialization constant, so use a for-loop instead.
		statement("for (int i = 0; i < int(", array_expr, "); i++)");
		begin_scope();
		if (is_builtin && !is_sample_mask)
			statement(new_expr, "[i] = gl_in[i].", expr, ";");
		else if (is_sample_mask)
		{
			SPIRType target_type { OpTypeInt };
			target_type.basetype = SPIRType::Int;
			statement(new_expr, "[i] = ", bitcast_expression(target_type, type.basetype, join(expr, "[i]")), ";");
		}
		else
			statement(new_expr, "[i] = ", expr, "[i];");
		end_scope();

		expr = std::move(new_expr);
	}
}